

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

Physical * __thiscall Matrix::pPhysical(Physical *__return_storage_ptr__,Matrix *this,int n)

{
  Physical *this_00;
  
  if (n < this->nMatrixDimension) {
    this_00 = this->pPhysicals + n;
  }
  else {
    this_00 = (Physical *)operator_new(0x98);
    Physical::Physical(this_00);
  }
  Physical::Physical(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Physical Matrix::pPhysical(int n)
{
	if( n<nMatrixDimension )
		return pPhysicals[n];
	else {
		// cout << "Matrix::getUnit(int n): error: n > matrix dimensions" << endl;
		return *(new Physical());
	}
}